

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_round2.cpp
# Opt level: O0

void anon_unknown.dwarf_b7780::check_round<unsigned_long>(void)

{
  bool bVar1;
  Message *pMVar2;
  char *pcVar3;
  unsigned_long v_00;
  AssertHelper local_d8;
  Message local_d0;
  uint local_c4;
  uint64_t local_c0;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar_3;
  Message local_a0;
  uint local_94;
  uint64_t local_90;
  undefined1 local_88 [8];
  AssertionResult gtest_ar_2;
  Message local_70;
  uint64_t local_68;
  undefined1 local_60 [8];
  AssertionResult gtest_ar_1;
  Message local_38;
  uint64_t local_30;
  undefined1 local_28 [8];
  AssertionResult gtest_ar;
  unsigned_long v;
  uint shift;
  
  v._4_4_ = 0x3f;
  checkn<unsigned_long,_62U>::operator()((checkn<unsigned_long,_62U> *)((long)&v + 3));
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x8000000000000000;
  local_30 = pstore::round_to_power_of_2(0x7fffffffffffffff);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_28,"pstore::round_to_power_of_2 (T{v - 1})","v",&local_30,
             (unsigned_long *)&gtest_ar.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(&local_38);
    pMVar2 = testing::Message::operator<<(&local_38,(char (*) [5])"(1<<");
    pMVar2 = testing::Message::operator<<(pMVar2,(uint *)((long)&v + 4));
    pMVar2 = testing::Message::operator<<(pMVar2,(char (*) [22])")-1 should become 1<<");
    pMVar2 = testing::Message::operator<<(pMVar2,(uint *)((long)&v + 4));
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_28);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_round2.cpp"
               ,0x3b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,pMVar2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  local_68 = pstore::round_to_power_of_2(0x8000000000000000);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_60,"pstore::round_to_power_of_2 (T{v + 0})","v",&local_68,
             (unsigned_long *)&gtest_ar.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    pMVar2 = testing::Message::operator<<(&local_70,(char (*) [5])"(1<<");
    pMVar2 = testing::Message::operator<<(pMVar2,(uint *)((long)&v + 4));
    pMVar2 = testing::Message::operator<<(pMVar2,(char (*) [20])") should become 1<<");
    pMVar2 = testing::Message::operator<<(pMVar2,(uint *)((long)&v + 4));
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_60);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_round2.cpp"
               ,0x3d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,pMVar2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  local_90 = pstore::round_to_power_of_2(0x8000000000000001);
  local_94 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_88,"pstore::round_to_power_of_2 (T{v + 1})","0U",&local_90,&local_94)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(&local_a0);
    pMVar2 = testing::Message::operator<<(&local_a0,(char (*) [5])"(1<<");
    pMVar2 = testing::Message::operator<<(pMVar2,(uint *)((long)&v + 4));
    pMVar2 = testing::Message::operator<<(pMVar2,(char (*) [20])")+1 should become 0");
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_round2.cpp"
               ,0x3f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,pMVar2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  v_00 = std::numeric_limits<unsigned_long>::max();
  local_c0 = pstore::round_to_power_of_2(v_00);
  local_c4 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_b8,"pstore::round_to_power_of_2 (std::numeric_limits<T>::max ())",
             "0U",&local_c0,&local_c4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    pMVar2 = testing::Message::operator<<(&local_d0,(char (*) [20])"max should become 0");
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_round2.cpp"
               ,0x41,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d8,pMVar2);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  return;
}

Assistant:

void check_round () {
        constexpr unsigned shift = sizeof (T) * 8 - 1;
        checkn<T, shift - 1>{}();

        constexpr auto v = T{1} << shift;
        EXPECT_EQ (pstore::round_to_power_of_2 (T{v - 1}), v)
            << "(1<<" << shift << ")-1 should become 1<<" << shift;
        EXPECT_EQ (pstore::round_to_power_of_2 (T{v + 0}), v)
            << "(1<<" << shift << ") should become 1<<" << shift;
        EXPECT_EQ (pstore::round_to_power_of_2 (T{v + 1}), 0U)
            << "(1<<" << shift << ")+1 should become 0";
        EXPECT_EQ (pstore::round_to_power_of_2 (std::numeric_limits<T>::max ()), 0U)
            << "max should become 0";
    }